

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# platform.cpp
# Opt level: O1

socket_t net_connect(char *ip,int port)

{
  in_addr_t iVar1;
  int __fd;
  uint uVar2;
  int iVar3;
  int iVar4;
  sockaddr_in addr;
  int enable;
  sockaddr local_28;
  undefined4 local_14;
  
  local_28.sa_data[6] = '\0';
  local_28.sa_data[7] = '\0';
  local_28.sa_data[8] = '\0';
  local_28.sa_data[9] = '\0';
  local_28.sa_data[10] = '\0';
  local_28.sa_data[0xb] = '\0';
  local_28.sa_data[0xc] = '\0';
  local_28.sa_data[0xd] = '\0';
  local_28.sa_family = 2;
  local_28.sa_data[0] = '\0';
  local_28.sa_data[1] = '\0';
  local_28.sa_data[2] = '\0';
  local_28.sa_data[3] = '\0';
  local_28.sa_data[4] = '\0';
  local_28.sa_data[5] = '\0';
  iVar1 = inet_addr(ip);
  local_28.sa_data._0_2_ = (ushort)port << 8 | (ushort)port >> 8;
  local_28.sa_data._2_4_ = iVar1;
  __fd = socket(2,1,0);
  iVar4 = -1;
  if (-1 < __fd) {
    uVar2 = fcntl(__fd,3,0);
    fcntl(__fd,4,(ulong)(uVar2 | 0x800));
    local_14 = 1;
    setsockopt(__fd,6,1,&local_14,4);
    iVar3 = connect(__fd,&local_28,0x10);
    iVar4 = __fd;
    if ((iVar3 < 0) && (iVar3 = get_network_err(), iVar3 != 0)) {
      close(__fd);
      iVar4 = -1;
    }
  }
  return iVar4;
}

Assistant:

socket_t net_connect(const char* ip, int port)
{
    sockaddr_in addr;
    int len = sizeof (struct sockaddr_in);
    memset(&addr, 0, sizeof(addr));
    addr.sin_family = AF_INET;
    addr.sin_addr.s_addr = inet_addr(ip);
    addr.sin_port = htons(port);

    socket_t fd = ::socket(AF_INET, SOCK_STREAM, 0);
    if (fd < 0) 
    {
        return -1;
    }

    set_no_block(fd);
    set_no_delay(fd);

    if (::connect(fd, (struct sockaddr*)&addr, len) < 0)
    {
        if (get_network_err() != 0)
        {
            close_socket(fd);
            return -1;
        }
    }

    return fd;
}